

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void list_move_node_to_tail(list *list,node *node)

{
  if (node->next != (node *)0x0) {
    list_remove(list,node);
    list_insert_node_after(list,list->tail,node);
    return;
  }
  return;
}

Assistant:

void list_move_node_to_tail(struct list *list, struct node *node)
{
        if (node->next == NULL) {
                return;
        }

        list_remove(list, node);

        list_insert_node_after(list, list->tail, node);
}